

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

size_t quantize_q6_K(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  size_t sVar1;
  long in_RDX;
  long in_R8;
  int64_t row;
  char *qrow;
  size_t row_size;
  int64_t in_stack_00000160;
  block_q6_K *in_stack_00000168;
  float *in_stack_00000170;
  block_q6_K *in_stack_00000178;
  float *in_stack_00000180;
  int64_t in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  long lVar2;
  
  sVar1 = ggml_row_size((ggml_type)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                        in_stack_ffffffffffffffb8);
  if (in_R8 == 0) {
    quantize_row_q6_K_ref(in_stack_00000170,in_stack_00000168,in_stack_00000160);
  }
  else {
    for (lVar2 = 0; lVar2 < in_RDX; lVar2 = lVar2 + 1) {
      quantize_row_q6_K_impl
                (in_stack_00000180,in_stack_00000178,(int64_t)in_stack_00000170,
                 (float *)in_stack_00000168);
    }
  }
  return in_RDX * sVar1;
}

Assistant:

size_t quantize_q6_K(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    size_t row_size = ggml_row_size(GGML_TYPE_Q6_K, n_per_row);
    if (!quant_weights) {
        quantize_row_q6_K_ref(src, dst, (int64_t)nrow*n_per_row);
    }
    else {
        char * qrow = (char *)dst;
        for (int64_t row = 0; row < nrow; ++row) {
            quantize_row_q6_K_impl(src, (block_q6_K*)qrow, n_per_row, quant_weights);
            src += n_per_row;
            qrow += row_size;
        }
    }
    return nrow * row_size;
}